

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O1

void __thiscall cmInstallScriptGenerator::~cmInstallScriptGenerator(cmInstallScriptGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallScriptGenerator_005cfab8;
  pcVar2 = (this->Script)._M_dataplus._M_p;
  paVar1 = &(this->Script).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  cmInstallGenerator::~cmInstallGenerator(&this->super_cmInstallGenerator);
  return;
}

Assistant:

cmInstallScriptGenerator
::~cmInstallScriptGenerator()
{
}